

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Duration.cpp
# Opt level: O0

void __thiscall Duration::Duration(Duration *this)

{
  Duration *this_local;
  
  this->_year = 0;
  this->_month = 0;
  this->_weeks = 0;
  this->_day = 0;
  this->_hours = 0;
  this->_minutes = 0;
  this->_seconds = 0;
  this->_period = 0;
  clear(this);
  return;
}

Assistant:

Duration::Duration ()
{
  clear ();
}